

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipTimer.h
# Opt level: O0

void __thiscall
MipTimer::reportMipEvaluateRootNodeClock(MipTimer *this,HighsTimerClock *mip_timer_clock)

{
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> *in_RSI;
  char *in_RDI;
  MipTimer *unaff_retaddr;
  vector<int,_std::allocator<int>_> mip_clock_list;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff60;
  allocator_type *in_stack_ffffffffffffff78;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff80;
  iterator piVar1;
  size_type sVar2;
  vector<int,_std::allocator<int>_> *__x;
  vector<int,_std::allocator<int>_> *this_00;
  double in_stack_ffffffffffffffd8;
  HighsInt in_stack_ffffffffffffffe4;
  HighsTimerClock *in_stack_ffffffffffffffe8;
  
  __x = (vector<int,_std::allocator<int>_> *)0x1800000017;
  this_00 = (vector<int,_std::allocator<int>_> *)0x1a00000019;
  piVar1 = (iterator)0x1400000013;
  sVar2 = 0x1600000015;
  std::allocator<int>::allocator((allocator<int> *)0x61137b);
  __l._M_len = sVar2;
  __l._M_array = piVar1;
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff80,__l,in_stack_ffffffffffffff78);
  std::allocator<int>::~allocator((allocator<int> *)0x6113a9);
  std::vector<int,_std::allocator<int>_>::vector(this_00,__x);
  reportMipClockList(unaff_retaddr,in_RDI,in_RSI,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe4
                     ,in_stack_ffffffffffffffd8);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff60);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff60);
  return;
}

Assistant:

void reportMipEvaluateRootNodeClock(const HighsTimerClock& mip_timer_clock) {
    const std::vector<HighsInt> mip_clock_list{
        kMipClockStartSymmetryDetection,
        kMipClockStartAnalyticCentreComputation,
        kMipClockEvaluateRootLp,
        kMipClockSeparateLpCuts,
        kMipClockRandomizedRounding,
        kMipClockPerformRestart,
        kMipClockRootSeparation,
        kMipClockFinishAnalyticCentreComputation,
        kMipClockRootCentralRounding,
        kMipClockRootSeparationRound0,
        kMipClockRootHeuristicsReducedCost,
        kMipClockRootSeparationRound1,
        kMipClockRootHeuristicsRens,
        kMipClockRootSeparationRound2,
        kMipClockRootFeasibilityPump,
        kMipClockRootSeparationRound3
        //	kMipClock@,
        //	kMipClock@
    };
    reportMipClockList(
        "MipEvaluateRootNode", mip_clock_list, mip_timer_clock,
        kMipClockEvaluateRootNode);  //, tolerance_percent_report);
  }